

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  size_t *this_00;
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  LogMessage *other;
  FileDescriptor *this_01;
  string *psVar6;
  FieldDescriptor *pFVar7;
  EnumDescriptor *descriptor;
  Descriptor *pDVar8;
  mapped_type *pmVar9;
  char *pcVar10;
  FieldGenerator *pFVar11;
  int __c;
  int i_00;
  int i_01;
  OneofDescriptor *oneof;
  OneofDescriptor *oneof_00;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  bool local_341;
  int local_328;
  int local_324;
  int i_6;
  int i_5;
  uint local_2fc;
  int local_2f8;
  int i_4;
  int totalInts;
  bool lazy_init;
  string local_2d0;
  allocator local_2a9;
  key_type local_2a8;
  string local_288;
  FieldDescriptor *local_268;
  FieldDescriptor *field;
  int j;
  string local_238;
  allocator local_211;
  key_type local_210;
  string local_1f0;
  allocator local_1c9;
  key_type local_1c8;
  string local_1a8;
  OneofDescriptor *local_188;
  OneofDescriptor *oneof_desc;
  int i_3;
  undefined1 local_158 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  int local_fc;
  undefined1 local_f8 [4];
  int i_2;
  int local_b4;
  undefined1 local_b0 [4];
  int i_1;
  int local_70;
  bool local_69;
  int i;
  bool is_own_file;
  string *file_name;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar2 = Params::store_unknown_fields(this->params_);
  if ((!bVar2) &&
     ((iVar3 = Descriptor::extension_count(this->descriptor_), iVar3 != 0 ||
      (iVar3 = Descriptor::extension_range_count(this->descriptor_), iVar3 != 0)))) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_message.cc"
               ,0x71);
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "Extensions are only supported in NANO_RUNTIME if the \'store_unknown_fields\' generator option is \'true\'\n"
                      );
    internal::LogFinisher::operator=((LogFinisher *)((long)&file_name + 3),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this_01 = Descriptor::file(this->descriptor_);
  _i = FileDescriptor::name_abi_cxx11_(this_01);
  bVar2 = Params::java_multiple_files(this->params_,_i);
  local_341 = false;
  if (bVar2) {
    pDVar8 = Descriptor::containing_type(this->descriptor_);
    local_341 = pDVar8 == (Descriptor *)0x0;
  }
  pPVar1 = local_18;
  local_69 = local_341;
  if (local_341 == false) {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"\npublic static final class $classname$ extends\n","classname",psVar6
                      );
  }
  else {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "\n@SuppressWarnings(\"hiding\")\npublic final class $classname$ extends\n",
                       "classname",psVar6);
  }
  bVar2 = Params::store_unknown_fields(this->params_);
  if ((bVar2) && (bVar2 = Params::parcelable_messages(this->params_), pPVar1 = local_18, bVar2)) {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>"
                       ,"classname",psVar6);
  }
  else {
    bVar2 = Params::store_unknown_fields(this->params_);
    pPVar1 = local_18;
    if (bVar2) {
      psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(pPVar1,"    com.google.protobuf.nano.ExtendableMessageNano<$classname$>",
                         "classname",psVar6);
    }
    else {
      bVar2 = Params::parcelable_messages(this->params_);
      if (bVar2) {
        io::Printer::Print(local_18,"    com.google.protobuf.nano.android.ParcelableMessageNano");
      }
      else {
        io::Printer::Print(local_18,"    com.google.protobuf.nano.MessageNano");
      }
    }
  }
  bVar2 = Params::generate_clone(this->params_);
  if (bVar2) {
    io::Printer::Print(local_18," implements java.lang.Cloneable {\n");
  }
  else {
    io::Printer::Print(local_18," {\n");
  }
  io::Printer::Indent(local_18);
  bVar2 = Params::parcelable_messages(this->params_);
  pPVar1 = local_18;
  if (bVar2) {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "\n// Used by Parcelable\n@SuppressWarnings({\"unused\"})\npublic static final android.os.Parcelable.Creator<$classname$> CREATOR =\n    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n        $classname$>($classname$.class);\n"
                       ,"classname",psVar6);
  }
  for (local_70 = 0; iVar3 = local_70, iVar4 = Descriptor::extension_count(this->descriptor_),
      iVar3 < iVar4; local_70 = local_70 + 1) {
    pFVar7 = Descriptor::extension(this->descriptor_,local_70);
    ExtensionGenerator::ExtensionGenerator((ExtensionGenerator *)local_b0,pFVar7,this->params_);
    ExtensionGenerator::Generate((ExtensionGenerator *)local_b0,local_18);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)local_b0);
  }
  for (local_b4 = 0; iVar3 = local_b4, iVar4 = Descriptor::enum_type_count(this->descriptor_),
      iVar3 < iVar4; local_b4 = local_b4 + 1) {
    descriptor = Descriptor::enum_type(this->descriptor_,local_b4);
    EnumGenerator::EnumGenerator((EnumGenerator *)local_f8,descriptor,this->params_);
    EnumGenerator::Generate((EnumGenerator *)local_f8,local_18);
    EnumGenerator::~EnumGenerator((EnumGenerator *)local_f8);
  }
  for (local_fc = 0; iVar3 = Descriptor::nested_type_count(this->descriptor_), local_fc < iVar3;
      local_fc = local_fc + 1) {
    pDVar8 = Descriptor::nested_type(this->descriptor_,local_fc);
    bVar2 = IsMapEntry(pDVar8);
    if (!bVar2) {
      pDVar8 = Descriptor::nested_type(this->descriptor_,local_fc);
      this_00 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      MessageGenerator((MessageGenerator *)this_00,pDVar8,this->params_);
      Generate((MessageGenerator *)this_00,local_18);
      ~MessageGenerator((MessageGenerator *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_158);
  psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_3,"message_name",(allocator *)((long)&oneof_desc + 7));
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_158,(key_type *)&i_3);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)psVar6);
  std::__cxx11::string::~string((string *)&i_3);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oneof_desc + 7));
  for (oneof_desc._0_4_ = 0; iVar3 = (int)oneof_desc,
      iVar4 = Descriptor::oneof_decl_count(this->descriptor_), iVar3 < iVar4;
      oneof_desc._0_4_ = (int)oneof_desc + 1) {
    local_188 = Descriptor::oneof_decl(this->descriptor_,(int)oneof_desc);
    UnderscoresToCamelCase_abi_cxx11_(&local_1a8,(javanano *)local_188,oneof);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c8,"oneof_name",&local_1c9);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_158,&local_1c8);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string((string *)&local_1a8);
    UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_1f0,(javanano *)local_188,oneof_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"oneof_capitalized_name",&local_211);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_158,&local_210);
    psVar6 = &local_1f0;
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string((string *)&local_1f0);
    pcVar10 = OneofDescriptor::index(local_188,(char *)psVar6,__c);
    SimpleItoa_abi_cxx11_(&local_238,(protobuf *)((ulong)pcVar10 & 0xffffffff),i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j,"oneof_index",(allocator *)((long)&field + 7));
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_158,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_238);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    std::__cxx11::string::~string((string *)&local_238);
    for (field._0_4_ = 0; iVar3 = (int)field, iVar4 = OneofDescriptor::field_count(local_188),
        iVar3 < iVar4; field._0_4_ = (int)field + 1) {
      local_268 = OneofDescriptor::field(local_188,(int)field);
      uVar5 = FieldDescriptor::number(local_268);
      SimpleItoa_abi_cxx11_(&local_288,(protobuf *)(ulong)uVar5,i_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a8,"number",&local_2a9);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_158,&local_2a8);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string((string *)&local_288);
      psVar6 = FieldDescriptor::name_abi_cxx11_(local_268);
      ToUpper(&local_2d0,psVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&totalInts,"cap_field_name",(allocator *)((long)&i_4 + 3));
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_158,(key_type *)&totalInts);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&totalInts);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_4 + 3));
      std::__cxx11::string::~string((string *)&local_2d0);
      io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_158,
                         "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
    }
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_158,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_158,
                       "public int get$oneof_capitalized_name$Case() {\n  return this.$oneof_name$Case_;\n}\n"
                      );
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_158,
                       "public $message_name$ clear$oneof_capitalized_name$() {\n  this.$oneof_name$Case_ = 0;\n  this.$oneof_name$_ = null;\n  return this;\n}\n"
                      );
  }
  iVar3 = Descriptor::extension_count(this->descriptor_);
  pPVar1 = local_18;
  i_4._2_1_ = iVar3 == 0;
  if ((bool)i_4._2_1_) {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "\nprivate static volatile $classname$[] _emptyArray;\npublic static $classname$[] emptyArray() {\n  // Lazily initializes the empty array\n  if (_emptyArray == null) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (_emptyArray == null) {\n        _emptyArray = new $classname$[0];\n      }\n    }\n  }\n  return _emptyArray;\n}\n"
                       ,"classname",psVar6);
  }
  else {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "\nprivate static final $classname$[] EMPTY_ARRAY = {};\npublic static $classname$[] emptyArray() {\n  return EMPTY_ARRAY;\n}\n"
                       ,"classname",psVar6);
  }
  iVar3 = FieldGeneratorMap::total_bits(&this->field_generators_);
  local_2f8 = (iVar3 + 0x1f) / 0x20;
  if (0 < local_2f8) {
    io::Printer::Print(local_18,"\n");
    uVar12 = extraout_RDX;
    for (local_2fc = 0; pPVar1 = local_18, (int)local_2fc < local_2f8; local_2fc = local_2fc + 1) {
      GetBitFieldName_abi_cxx11_((string *)&i_6,(javanano *)(ulong)local_2fc,(int)uVar12);
      io::Printer::Print(pPVar1,"private int $bit_field_name$;\n","bit_field_name",(string *)&i_6);
      std::__cxx11::string::~string((string *)&i_6);
      uVar12 = extraout_RDX_00;
    }
  }
  for (local_324 = 0; iVar3 = Descriptor::field_count(this->descriptor_), local_324 < iVar3;
      local_324 = local_324 + 1) {
    io::Printer::Print(local_18,"\n");
    pPVar1 = local_18;
    pFVar7 = Descriptor::field(this->descriptor_,local_324);
    PrintFieldComment(pPVar1,pFVar7);
    pFVar7 = Descriptor::field(this->descriptor_,local_324);
    pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
    (*pFVar11->_vptr_FieldGenerator[4])(pFVar11,local_18,(ulong)(i_4._2_1_ & 1));
  }
  if (((i_4._2_1_ & 1) == 0) ||
     (bVar2 = FieldGeneratorMap::saved_defaults_needed(&this->field_generators_), pPVar1 = local_18,
     !bVar2)) {
    pPVar1 = local_18;
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"\npublic $classname$() {\n","classname",psVar6);
    bVar2 = Params::generate_clear(this->params_);
    if (bVar2) {
      io::Printer::Print(local_18,"  clear();\n");
    }
    else {
      io::Printer::Indent(local_18);
      GenerateFieldInitializers(this,local_18);
      io::Printer::Outdent(local_18);
    }
    io::Printer::Print(local_18,"}\n");
  }
  else {
    psVar6 = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,
                       "\nprivate static volatile boolean _classInitialized;\n\npublic $classname$() {\n  // Lazily initializes the field defaults\n  if (!_classInitialized) {\n    synchronized (\n        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n      if (!_classInitialized) {\n"
                       ,"classname",psVar6);
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    for (local_328 = 0; iVar3 = Descriptor::field_count(this->descriptor_), local_328 < iVar3;
        local_328 = local_328 + 1) {
      pFVar7 = Descriptor::field(this->descriptor_,local_328);
      pFVar11 = FieldGeneratorMap::get(&this->field_generators_,pFVar7);
      (*pFVar11->_vptr_FieldGenerator[3])(pFVar11,local_18);
    }
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"        _classInitialized = true;\n      }\n    }\n  }\n");
    bVar2 = Params::generate_clear(this->params_);
    if (bVar2) {
      io::Printer::Print(local_18,"  clear();\n");
    }
    io::Printer::Print(local_18,"}\n");
  }
  GenerateClear(this,local_18);
  bVar2 = Params::generate_clone(this->params_);
  if (bVar2) {
    GenerateClone(this,local_18);
  }
  bVar2 = Params::generate_equals(this->params_);
  if (bVar2) {
    GenerateEquals(this,local_18);
    GenerateHashCode(this,local_18);
  }
  GenerateMessageSerializationMethods(this,local_18);
  GenerateMergeFromMethods(this,local_18);
  GenerateParseFromMethods(this,local_18);
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_158);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  if (!params_.store_unknown_fields() &&
      (descriptor_->extension_count() != 0 || descriptor_->extension_range_count() != 0)) {
    GOOGLE_LOG(FATAL) << "Extensions are only supported in NANO_RUNTIME if the "
        "'store_unknown_fields' generator option is 'true'\n";
  }

  const string& file_name = descriptor_->file()->name();
  bool is_own_file =
    params_.java_multiple_files(file_name)
      && descriptor_->containing_type() == NULL;

  if (is_own_file) {
    // Note: constants (from enums and fields requiring stored defaults, emitted in the loop below)
    // may have the same names as constants in the nested classes. This causes Java warnings, but
    // is not fatal, so we suppress those warnings here in the top-most class declaration.
    printer->Print(
      "\n"
      "@SuppressWarnings(\"hiding\")\n"
      "public final class $classname$ extends\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "public static final class $classname$ extends\n",
      "classname", descriptor_->name());
  }
  if (params_.store_unknown_fields() && params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.store_unknown_fields()) {
    printer->Print(
      "    com.google.protobuf.nano.ExtendableMessageNano<$classname$>",
      "classname", descriptor_->name());
  } else if (params_.parcelable_messages()) {
    printer->Print(
      "    com.google.protobuf.nano.android.ParcelableMessageNano");
  } else {
    printer->Print(
      "    com.google.protobuf.nano.MessageNano");
  }
  if (params_.generate_clone()) {
    printer->Print(" implements java.lang.Cloneable {\n");
  } else {
    printer->Print(" {\n");
  }
  printer->Indent();

  if (params_.parcelable_messages()) {
    printer->Print(
      "\n"
      "// Used by Parcelable\n"
      "@SuppressWarnings({\"unused\"})\n"
      "public static final android.os.Parcelable.Creator<$classname$> CREATOR =\n"
      "    new com.google.protobuf.nano.android.ParcelableMessageNanoCreator<\n"
      "        $classname$>($classname$.class);\n",
      "classname", descriptor_->name());
  }

  // Nested types and extensions
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), params_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    MessageGenerator(descriptor_->nested_type(i), params_).Generate(printer);
  }

  // oneof
  map<string, string> vars;
  vars["message_name"] = descriptor_->name();
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof_desc = descriptor_->oneof_decl(i);
    vars["oneof_name"] = UnderscoresToCamelCase(oneof_desc);
    vars["oneof_capitalized_name"] =
        UnderscoresToCapitalizedCamelCase(oneof_desc);
    vars["oneof_index"] = SimpleItoa(oneof_desc->index());
    // Oneof Constants
    for (int j = 0; j < oneof_desc->field_count(); j++) {
      const FieldDescriptor* field = oneof_desc->field(j);
      vars["number"] = SimpleItoa(field->number());
      vars["cap_field_name"] = ToUpper(field->name());
      printer->Print(vars,
        "public static final int $cap_field_name$_FIELD_NUMBER = $number$;\n");
    }
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    printer->Print(vars,
      "public int get$oneof_capitalized_name$Case() {\n"
      "  return this.$oneof_name$Case_;\n"
      "}\n");
    // Oneof clear
    printer->Print(vars,
      "public $message_name$ clear$oneof_capitalized_name$() {\n"
      "  this.$oneof_name$Case_ = 0;\n"
      "  this.$oneof_name$_ = null;\n"
      "  return this;\n"
      "}\n");
  }

  // Lazy initialization of otherwise static final fields can help prevent the
  // class initializer from being generated. We want to prevent it because it
  // stops ProGuard from inlining any methods in this class into call sites and
  // therefore reducing the method count. However, extensions are best kept as
  // public static final fields with initializers, so with their existence we
  // won't bother with lazy initialization.
  bool lazy_init = descriptor_->extension_count() == 0;

  // Empty array
  if (lazy_init) {
    printer->Print(
      "\n"
      "private static volatile $classname$[] _emptyArray;\n"
      "public static $classname$[] emptyArray() {\n"
      "  // Lazily initializes the empty array\n"
      "  if (_emptyArray == null) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (_emptyArray == null) {\n"
      "        _emptyArray = new $classname$[0];\n"
      "      }\n"
      "    }\n"
      "  }\n"
      "  return _emptyArray;\n"
      "}\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "\n"
      "private static final $classname$[] EMPTY_ARRAY = {};\n"
      "public static $classname$[] emptyArray() {\n"
      "  return EMPTY_ARRAY;\n"
      "}\n",
      "classname", descriptor_->name());
  }

  // Integers for bit fields
  int totalInts = (field_generators_.total_bits() + 31) / 32;
  if (totalInts > 0) {
    printer->Print("\n");
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // Fields and maybe their default values
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    PrintFieldComment(printer, descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(
        printer, lazy_init);
  }

  // Constructor, with lazy init code if needed
  if (lazy_init && field_generators_.saved_defaults_needed()) {
    printer->Print(
      "\n"
      "private static volatile boolean _classInitialized;\n"
      "\n"
      "public $classname$() {\n"
      "  // Lazily initializes the field defaults\n"
      "  if (!_classInitialized) {\n"
      "    synchronized (\n"
      "        com.google.protobuf.nano.InternalNano.LAZY_INIT_LOCK) {\n"
      "      if (!_classInitialized) {\n",
      "classname", descriptor_->name());
    printer->Indent();
    printer->Indent();
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitSavedDefaultCode(printer);
    }
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "        _classInitialized = true;\n"
      "      }\n"
      "    }\n"
      "  }\n");
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    }
    printer->Print("}\n");
  } else {
    printer->Print(
      "\n"
      "public $classname$() {\n",
      "classname", descriptor_->name());
    if (params_.generate_clear()) {
      printer->Print("  clear();\n");
    } else {
      printer->Indent();
      GenerateFieldInitializers(printer);
      printer->Outdent();
    }
    printer->Print("}\n");
  }

  // Other methods in this class

  GenerateClear(printer);

  if (params_.generate_clone()) {
    GenerateClone(printer);
  }

  if (params_.generate_equals()) {
    GenerateEquals(printer);
    GenerateHashCode(printer);
  }

  GenerateMessageSerializationMethods(printer);
  GenerateMergeFromMethods(printer);
  GenerateParseFromMethods(printer);

  printer->Outdent();
  printer->Print("}\n");
}